

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl_Still::commitImageEffect(Private_Impl_Still *this)

{
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  Private_Impl_Still *in_RDI;
  MMAL_PARAMETER_IMAGEFX_T imgFX;
  MMAL_PARAMETER_HEADER_T local_14;
  MMAL_PARAM_IMAGEFX_T local_c;
  
  local_14.id = 0x10006;
  local_14.size = 0xc;
  local_c = convertImageEffect(in_RDI,in_RDI->imageEffect);
  MVar1 = mmal_port_parameter_set(in_RDI->camera->control,&local_14);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
    std::operator<<(poVar2,": Failed to set image effect parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl_Still::commitImageEffect() {
            MMAL_PARAMETER_IMAGEFX_T imgFX = {{MMAL_PARAMETER_IMAGE_EFFECT,sizeof ( imgFX ) }, convertImageEffect ( imageEffect ) };
            if ( mmal_port_parameter_set ( camera->control, &imgFX.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Failed to set image effect parameter.\n";
        }